

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void ecs_hash(void *data,ecs_size_t length,uint64_t *result)

{
  size_t length_00;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t h_2;
  uint32_t h_1;
  uint64_t *result_local;
  void *pvStack_10;
  ecs_size_t length_local;
  void *data_local;
  
  local_24 = 0;
  local_28 = 0;
  _h_2 = result;
  result_local._4_4_ = length;
  pvStack_10 = data;
  length_00 = ecs_to_size_t((long)length);
  hashlittle2(data,length_00,&local_24,&local_28);
  *_h_2 = CONCAT44(local_28,local_24);
  return;
}

Assistant:

void ecs_hash(
    const void *data,
    ecs_size_t length,
    uint64_t *result)
{
    uint32_t h_1 = 0;
    uint32_t h_2 = 0;

    hashlittle2(
        data,
        ecs_to_size_t(length),
        &h_1,
        &h_2);

    *result = h_1 | ((uint64_t)h_2 << 32);
}